

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

void __thiscall semver::version<int,_int,_int>::clear(version<int,_int,_int> *this)

{
  version<int,_int,_int> *this_local;
  
  this->major_ = 0;
  this->minor_ = 1;
  this->patch_ = 0;
  std::__cxx11::string::clear();
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::clear(&this->prerelease_identifiers);
  std::__cxx11::string::clear();
  return;
}

Assistant:

SEMVER_CONSTEXPR void clear() noexcept {
      major_ = 0;
      minor_ = 1;
      patch_ = 0;

      prerelease_tag_.clear();
      prerelease_identifiers.clear();
      build_metadata_.clear();
    }